

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O2

EStatusCode __thiscall
PDFUsedFont::WriteState(PDFUsedFont *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  IWrittenFont *pIVar1;
  EStatusCode EVar2;
  DictionaryContext *this_00;
  IndirectObjectsReferenceRegistry *this_01;
  ObjectIDType inObjectReference;
  allocator<char> local_49;
  string local_48;
  
  EVar2 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar2 == eSuccess) {
    this_00 = ObjectsContext::StartDictionary(inStateWriter);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Type",&local_49);
    DictionaryContext::WriteKey(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"PDFUsedFont",&local_49);
    DictionaryContext::WriteNameValue(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (this->mWrittenFont == (IWrittenFont *)0x0) {
      inObjectReference = 0;
    }
    else {
      this_01 = ObjectsContext::GetInDirectObjectsRegistry(inStateWriter);
      inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"mWrittenFont",&local_49);
      DictionaryContext::WriteKey(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference);
    }
    ObjectsContext::EndDictionary(inStateWriter,this_00);
    ObjectsContext::EndIndirectObject(inStateWriter);
    pIVar1 = this->mWrittenFont;
    if (pIVar1 != (IWrittenFont *)0x0) {
      (*pIVar1->_vptr_IWrittenFont[5])(pIVar1,inStateWriter,inObjectReference);
    }
  }
  return EVar2;
}

Assistant:

EStatusCode PDFUsedFont::WriteState(ObjectsContext* inStateWriter,ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != eSuccess)
		return status;
	DictionaryContext* pdfUsedFontObject = inStateWriter->StartDictionary();

	pdfUsedFontObject->WriteKey("Type");
	pdfUsedFontObject->WriteNameValue("PDFUsedFont");

	ObjectIDType writtenFontObject = 0;

	if(mWrittenFont)
	{
		writtenFontObject = inStateWriter->GetInDirectObjectsRegistry().AllocateNewObjectID();

		pdfUsedFontObject->WriteKey("mWrittenFont");
		pdfUsedFontObject->WriteNewObjectReferenceValue(writtenFontObject);
	}

	inStateWriter->EndDictionary(pdfUsedFontObject);
	inStateWriter->EndIndirectObject();

	if(mWrittenFont)
		mWrittenFont->WriteState(inStateWriter,writtenFontObject);

	return status;
}